

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * extraBddAndPermute(DdHashTable *table,DdManager *ddF,DdNode *bF,DdManager *ddG,DdNode *bG,
                           int *pPermute)

{
  int *piVar1;
  uint uVar2;
  DdManager *ddG_00;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  uint uVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  timespec ts;
  timespec local_68;
  DdNode *local_58;
  uint *local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdManager *local_38;
  
  pDVar9 = (DdNode *)((ulong)ddF->one ^ 1);
  if (pDVar9 == bF) {
    return pDVar9;
  }
  if ((DdNode *)((ulong)ddG->one ^ 1) == bG) {
    return pDVar9;
  }
  if (ddG->one == bG) {
    return bF;
  }
  local_38 = ddG;
  pDVar9 = cuddHashTableLookup2(table,bF,bG);
  ddG_00 = local_38;
  if (pDVar9 == (DdNode *)0x0) {
    Counter = Counter + 1;
    if (ddF->TimeStop != 0) {
      iVar3 = clock_gettime(3,&local_68);
      if (iVar3 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      if (ddF->TimeStop < lVar6) {
        return (DdNode *)0x0;
      }
    }
    if (ddG_00->TimeStop != 0) {
      iVar3 = clock_gettime(3,&local_68);
      if (iVar3 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      if (ddG_00->TimeStop < lVar6) {
        return (DdNode *)0x0;
      }
    }
    local_50 = (uint *)((ulong)bF & 0xfffffffffffffffe);
    uVar4 = 0x7fffffff;
    if ((ulong)*local_50 != 0x7fffffff) {
      uVar4 = ddF->perm[*local_50];
    }
    puVar5 = (uint *)((ulong)bG & 0xfffffffffffffffe);
    if (pPermute != (int *)0x0) {
      puVar5 = (uint *)(pPermute + *puVar5);
    }
    if (*puVar5 == 0x7fffffff) {
      puVar5 = (uint *)((ulong)bG & 0xfffffffffffffffe);
      if (pPermute != (int *)0x0) {
        puVar5 = (uint *)(pPermute + *puVar5);
      }
    }
    else {
      puVar5 = (uint *)((ulong)bG & 0xfffffffffffffffe);
      if (pPermute != (int *)0x0) {
        puVar5 = (uint *)(pPermute + *puVar5);
      }
      puVar5 = (uint *)(ddF->perm + *puVar5);
    }
    uVar2 = *puVar5;
    uVar7 = uVar2;
    if ((int)uVar4 < (int)uVar2) {
      uVar7 = uVar4;
    }
    if ((int)uVar7 < ddF->size) {
      local_40 = bF;
      pDVar9 = bF;
      if ((int)uVar4 <= (int)uVar2) {
        pDVar9 = (DdNode *)((ulong)((uint)bF & 1) ^ *(ulong *)(local_50 + 6));
        local_40 = (DdNode *)((ulong)((uint)bF & 1) ^ *(ulong *)(local_50 + 4));
      }
      pDVar8 = bG;
      if ((int)uVar2 <= (int)uVar4) {
        pDVar8 = (DdNode *)
                 ((ulong)((uint)bG & 1) ^ *(ulong *)(((ulong)bG & 0xfffffffffffffffe) + 0x18));
      }
      pDVar10 = bG;
      if ((int)uVar2 <= (int)uVar4) {
        pDVar10 = (DdNode *)
                  ((ulong)((uint)bG & 1) ^ *(ulong *)(((ulong)bG & 0xfffffffffffffffe) + 0x10));
      }
      local_48 = ddF->vars[ddF->invperm[(int)uVar7]];
      pDVar9 = extraBddAndPermute(table,ddF,pDVar9,ddG_00,pDVar8,pPermute);
      if (pDVar9 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        local_58 = bF;
        pDVar8 = extraBddAndPermute(table,ddF,local_40,ddG_00,pDVar10,pPermute);
        if (pDVar8 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar10 = cuddBddIteRecur(ddF,local_48,pDVar8,pDVar9);
          if (pDVar10 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_IterDerefBdd(ddF,pDVar9);
            Cudd_IterDerefBdd(ddF,pDVar8);
            cuddHashTableInsert2
                      (table,local_58,bG,pDVar10,
                       (ulong)*(uint *)(((ulong)bG & 0xfffffffffffffffe) + 4) * (ulong)local_50[1] +
                       -1);
            piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            return pDVar10;
          }
          Cudd_IterDerefBdd(ddF,pDVar9);
          pDVar9 = pDVar8;
        }
        Cudd_IterDerefBdd(ddF,pDVar9);
      }
      return (DdNode *)0x0;
    }
    __assert_fail("Lev < ddF->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddMisc.c"
                  ,0x88e,
                  "DdNode *extraBddAndPermute(DdHashTable *, DdManager *, DdNode *, DdManager *, DdNode *, int *)"
                 );
  }
  return pDVar9;
}

Assistant:

DdNode * extraBddAndPermute( DdHashTable * table, DdManager * ddF, DdNode * bF, DdManager * ddG, DdNode * bG, int * pPermute )
{
    DdNode * bF0, * bF1, * bG0, * bG1, * bRes0, * bRes1, * bRes, * bVar;
    int LevF, LevG, Lev;

    // if F == 0, return 0 
    if ( bF == Cudd_Not(ddF->one) )
        return Cudd_Not(ddF->one);
    // if G == 0, return 0 
    if ( bG == Cudd_Not(ddG->one) )
        return Cudd_Not(ddF->one);
    // if G == 1, return F
    if ( bG == ddG->one )
        return bF;
    // cannot use F == 1, because the var order of G has to be changed

    // check cache
    if ( //(Cudd_Regular(bF)->ref != 1 || Cudd_Regular(bG)->ref != 1) && 
         (bRes = cuddHashTableLookup2(table, bF, bG)) )
        return bRes;
    Counter++;

    if ( ddF->TimeStop && Abc_Clock() > ddF->TimeStop )
        return NULL;
    if ( ddG->TimeStop && Abc_Clock() > ddG->TimeStop )
        return NULL;

    // find the topmost variable in F and G using var order of F
    LevF = cuddI( ddF, Cudd_Regular(bF)->index );
    LevG = cuddI( ddF, pPermute ? pPermute[Cudd_Regular(bG)->index] : Cudd_Regular(bG)->index );
    Lev  = Abc_MinInt( LevF, LevG );
    assert( Lev < ddF->size );
    bVar = ddF->vars[ddF->invperm[Lev]];

    // cofactor
    bF0 = (Lev < LevF) ? bF : Cudd_NotCond( cuddE(Cudd_Regular(bF)), Cudd_IsComplement(bF) );
    bF1 = (Lev < LevF) ? bF : Cudd_NotCond( cuddT(Cudd_Regular(bF)), Cudd_IsComplement(bF) );
    bG0 = (Lev < LevG) ? bG : Cudd_NotCond( cuddE(Cudd_Regular(bG)), Cudd_IsComplement(bG) );
    bG1 = (Lev < LevG) ? bG : Cudd_NotCond( cuddT(Cudd_Regular(bG)), Cudd_IsComplement(bG) );

    // call for cofactors
    bRes0 = extraBddAndPermute( table, ddF, bF0, ddG, bG0, pPermute );
    if ( bRes0 == NULL ) 
        return NULL;
    cuddRef( bRes0 );
    // call for cofactors
    bRes1 = extraBddAndPermute( table, ddF, bF1, ddG, bG1, pPermute );
    if ( bRes1 == NULL ) 
    {
        Cudd_IterDerefBdd( ddF, bRes0 );
        return NULL;
    }
    cuddRef( bRes1 );

    // compose the result
    bRes = cuddBddIteRecur( ddF, bVar, bRes1, bRes0 );
    if ( bRes == NULL )
    {
        Cudd_IterDerefBdd( ddF, bRes0 );
        Cudd_IterDerefBdd( ddF, bRes1 );
        return NULL;
    }
    cuddRef( bRes );
    Cudd_IterDerefBdd( ddF, bRes0 );
    Cudd_IterDerefBdd( ddF, bRes1 );

    // cache the result
//    if ( Cudd_Regular(bF)->ref != 1 || Cudd_Regular(bG)->ref != 1 )
    {
        ptrint fanout = (ptrint)Cudd_Regular(bF)->ref * Cudd_Regular(bG)->ref;
        cuddSatDec(fanout);
        cuddHashTableInsert2( table, bF, bG, bRes, fanout );
    }
    cuddDeref( bRes );
    return bRes;
}